

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int ncnn::get_big_cpu_count(void)

{
  int iVar1;
  CpuSet *pCVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  long lVar5;
  
  pCVar2 = get_cpu_thread_affinity_mask(2);
  uVar3 = 0;
  iVar6 = 0;
  iVar7 = 0;
  auVar4 = _DAT_00309790;
  do {
    uVar11 = (pCVar2->cpu_set).__bits[uVar3 >> 6];
    auVar9 = auVar4 & _DAT_0030c5b0;
    auVar10._8_4_ = auVar9._8_4_;
    auVar10._12_4_ = auVar9._12_4_;
    auVar10._0_8_ = auVar9._8_8_;
    auVar8._8_4_ = (int)uVar11;
    auVar8._0_8_ = uVar11;
    auVar8._12_4_ = (int)(uVar11 >> 0x20);
    uVar11 = 1L << auVar9._0_8_ & uVar11;
    uVar12 = 1L << auVar10._8_8_ & auVar8._8_8_;
    iVar6 = (iVar6 - (uint)((int)uVar11 == 0 && (int)(uVar11 >> 0x20) == 0)) + 1;
    iVar7 = (iVar7 - (uint)((int)uVar12 == 0 && (int)(uVar12 >> 0x20) == 0)) + 1;
    uVar3 = uVar3 + 2;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
  } while (uVar3 != 0x400);
  iVar1 = iVar7 + iVar6;
  if (iVar7 + iVar6 == 0) {
    iVar1 = g_cpucount;
  }
  return iVar1;
}

Assistant:

int get_big_cpu_count()
{
    int big_cpu_count = get_cpu_thread_affinity_mask(2).num_enabled();
    return big_cpu_count ? big_cpu_count : g_cpucount;
}